

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void decompile(Decompiler *decompiler,Image *image,uint64_t time_offset,bool ignore_named_objects)

{
  DebugStream *pDVar1;
  allocator local_229;
  string local_228 [39];
  string local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [35];
  string local_1b5 [13];
  uint64_t local_1a8;
  uint64_t object_count;
  ostringstream decompiled_code;
  bool ignore_named_objects_local;
  uint64_t time_offset_local;
  Image *image_local;
  Decompiler *decompiler_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&object_count);
  local_1a8 = r_comp::Decompiler::decompile
                        ((Image *)decompiler,(ostringstream *)image,(ulong)&object_count,
                         SUB81(time_offset,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"main",&local_1d9);
  debug(local_1b5);
  pDVar1 = DebugStream::operator<<((DebugStream *)local_1b5,"decompilation:\n");
  std::__cxx11::ostringstream::str();
  DebugStream::operator<<(pDVar1,local_200);
  std::__cxx11::string::~string((string *)local_200);
  DebugStream::~DebugStream((DebugStream *)local_1b5);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"main",&local_229);
  debug(&local_201);
  pDVar1 = DebugStream::operator<<((DebugStream *)&local_201,local_1a8);
  DebugStream::operator<<(pDVar1,"objects");
  DebugStream::~DebugStream((DebugStream *)&local_201);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&object_count);
  return;
}

Assistant:

void decompile(Decompiler &decompiler, r_comp::Image *image, uint64_t time_offset, bool ignore_named_objects)
{
#ifdef DECOMPILE_ONE_BY_ONE
    uint64_t object_count = decompiler.decompile_references(image);
    std::cout << object_count << " objects in the image\n";

    while (1) {
        std::cout << "> which object (-1 to exit)?\n";
        int64_t index;
        std::cin >> index;

        if (index == -1) {
            break;
        }

        if (index >= object_count) {
            std::cout << "> there is only " << object_count << " objects\n";
            continue;
        }

        std::ostringstream decompiled_code;
        decompiler.decompile_object(index, &decompiled_code, time_offset);
        std::cout << "\n\n> DECOMPILATION\n\n" << decompiled_code.str() << std::endl;
    }

#else
    std::ostringstream decompiled_code;
    uint64_t object_count = decompiler.decompile(image, &decompiled_code, time_offset, ignore_named_objects);
    //uint64_t object_count=image->code_segment.objects.size();
    debug("main") << "decompilation:\n" << decompiled_code.str();
    //debug("main") << "image taken at:" << Time::ToString_year(image->timestamp);
    debug("main") << object_count << "objects";
#endif
}